

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backlog.cpp
# Opt level: O0

void __thiscall Backlog::remove_task(Backlog *this,shared_ptr<Task> *tsk)

{
  iterator __a;
  bool bVar1;
  reference __b;
  const_iterator local_30;
  __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
  local_20;
  iterator i;
  shared_ptr<Task> *tsk_local;
  Backlog *this_local;
  
  i._M_current = tsk;
  local_20._M_current =
       (shared_ptr<Task> *)
       std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::begin
                 (&this->TaskuriNeplanificate);
  while( true ) {
    local_28._M_current =
         (shared_ptr<Task> *)
         std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::end
                   (&this->TaskuriNeplanificate);
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
                      (&local_20,&local_28);
    __a = i;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __b = __gnu_cxx::
          __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
          ::operator*(&local_20);
    bVar1 = std::operator==(__a._M_current,__b);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
    ::operator++(&local_20);
  }
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Task>const*,std::vector<std::shared_ptr<Task>,std::allocator<std::shared_ptr<Task>>>>
  ::__normal_iterator<std::shared_ptr<Task>*>
            ((__normal_iterator<std::shared_ptr<Task>const*,std::vector<std::shared_ptr<Task>,std::allocator<std::shared_ptr<Task>>>>
              *)&local_30,&local_20);
  std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::erase
            (&this->TaskuriNeplanificate,local_30);
  return;
}

Assistant:

void Backlog::remove_task(const std::shared_ptr<Task> &tsk) {
    for(auto i=TaskuriNeplanificate.begin(); i != TaskuriNeplanificate.end(); ++i)
        if(operator==(tsk, *i))
        {
            TaskuriNeplanificate.erase(i);
            break;
        }
}